

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.h
# Opt level: O2

int __thiscall jrtplib::RTPPacketBuilder::IncrementTimestampDefault(RTPPacketBuilder *this)

{
  int iVar1;
  
  if (this->init == true) {
    if (this->deftsset == true) {
      this->timestamp = this->timestamp + this->defaulttimestampinc;
      return 0;
    }
    iVar1 = -0x12;
  }
  else {
    iVar1 = -0x14;
  }
  return iVar1;
}

Assistant:

inline int RTPPacketBuilder::IncrementTimestampDefault()
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	if (!deftsset)
		return ERR_RTP_PACKBUILD_DEFAULTTSINCNOTSET;
	timestamp += defaulttimestampinc;
	return 0;
}